

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int wally_aes_cbc(uchar *key,size_t key_len,uchar *iv,size_t iv_len,uchar *bytes,size_t bytes_len,
                 uint32_t flags,uchar *bytes_out,size_t len,size_t *written)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  uint *puVar6;
  ulong uVar7;
  uchar *puVar8;
  bool bVar9;
  uint uVar10;
  AES256_ctx ctx;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  undefined4 uStack_12c;
  uint local_124;
  AES256_ctx local_120;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (key == (uchar *)0x0) {
    return -2;
  }
  if (0x20 < key_len) {
    return -2;
  }
  if ((0x101010000U >> (key_len & 0x3f) & 1) == 0) {
    return -2;
  }
  if (bytes == (uchar *)0x0) {
    if ((~flags & 3) == 0) {
      return -2;
    }
    if (bytes_len != 0) {
      return -2;
    }
    if ((flags & 1) == 0) {
      return -2;
    }
    bVar9 = false;
  }
  else {
    if ((~flags & 3) == 0) {
      return -2;
    }
    bVar9 = (flags & 1) == 0;
  }
  if ((bool)(~bVar9 & (len & 0xf) != 0)) {
    return -2;
  }
  if ((flags & 2) == 0) {
    if (iv_len != 0x10 || iv == (uchar *)0x0) {
      return -2;
    }
  }
  else {
    if (iv_len != 0x10) {
      return -2;
    }
    if (iv == (uchar *)0x0) {
      return -2;
    }
    if ((bytes_len & 0xf) != 0) {
      return -2;
    }
  }
  if (3 < flags || written == (size_t *)0x0) {
    return -2;
  }
  uVar3 = bytes_len >> 4;
  if (bVar9) {
    uVar3 = uVar3 - 1;
    puVar6 = (uint *)(bytes + (bytes_len - 0x20));
    if (uVar3 == 0) {
      puVar6 = (uint *)iv;
    }
    aes_dec(&local_120,key,key_len,bytes + (bytes_len - 0x10),0x10,(uchar *)&local_138);
    local_138 = *puVar6 ^ local_138;
    uStack_134 = puVar6[1] ^ uStack_134;
    uStack_130 = puVar6[2] ^ uStack_130;
    uVar10 = puVar6[3] ^ uStack_12c;
    uStack_12c._3_1_ = (byte)(uVar10 >> 0x18);
    uVar7 = (ulong)(byte)(0x10 - (uStack_12c._3_1_ & 0xf));
    if ((uVar10 & 0xf000000) == 0) {
      uVar7 = 0;
    }
    sVar5 = uVar7 + uVar3 * 0x10;
    uStack_12c = uVar10;
  }
  else {
    uVar7 = bytes_len & 0xffffff0f;
    sVar5 = (bytes_len & 0xfffffffffffffff0) + 0x10;
  }
  *written = sVar5;
  iVar4 = 0;
  if (len <= sVar5 - 1) goto LAB_00495f54;
  if (bytes_out == (uchar *)0x0) {
    iVar4 = -2;
    goto LAB_00495f54;
  }
  if ((flags & 2) != 0) {
    memcpy(bytes_out + uVar3 * 0x10,&local_138,uVar7 & 0xff);
  }
  local_124 = (uint)uVar7;
  if (uVar3 != 0) {
    uVar7 = 0;
    puVar8 = iv;
    do {
      if (bVar9) {
        aes_dec(&local_120,key,key_len,bytes,0x10,bytes_out);
        lVar1 = 0;
        do {
          bytes_out[lVar1] = bytes_out[lVar1] ^ puVar8[lVar1];
          lVar1 = lVar1 + 1;
          iv = bytes;
        } while (lVar1 != 0x10);
      }
      else {
        lVar1 = 0;
        do {
          *(uchar *)((long)&local_138 + lVar1) = puVar8[lVar1] ^ bytes[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x10);
        aes_enc(&local_120,key,key_len,(uchar *)&local_138,0x10,bytes_out);
        iv = bytes_out;
      }
      bytes = bytes + 0x10;
      bytes_out = bytes_out + 0x10;
      uVar7 = uVar7 + 1;
      puVar8 = iv;
    } while (uVar7 != uVar3);
  }
  if (bVar9) goto LAB_00495f54;
  bVar2 = (byte)local_124;
  if (bVar2 == 0) {
    bVar2 = 0x10;
    uVar3 = 0;
LAB_00495f24:
    do {
      *(byte *)((long)&local_138 + uVar3) = iv[uVar3] ^ bVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x10);
  }
  else {
    uVar3 = (ulong)(local_124 & 0xff);
    uVar7 = 0;
    do {
      *(uchar *)((long)&local_138 + uVar7) = iv[uVar7] ^ bytes[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    if (bVar2 < 0x10) {
      bVar2 = 0x10 - bVar2;
      goto LAB_00495f24;
    }
  }
  aes_enc(&local_120,key,key_len,(uchar *)&local_138,0x10,bytes_out);
  iVar4 = 0;
LAB_00495f54:
  wally_clear_2(&local_138,0x10,&local_120,0xf0);
  return iVar4;
}

Assistant:

int wally_aes_cbc(const unsigned char *key, size_t key_len,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *bytes, size_t bytes_len,
                  uint32_t flags,
                  unsigned char *bytes_out, size_t len,
                  size_t *written)
{
    unsigned char buf[AES_BLOCK_LEN];
    AES256_ctx ctx;
    size_t i, n, blocks;
    unsigned char remainder;

    if (written)
        *written = 0;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        ((flags & AES_FLAG_ENCRYPT) && (len % AES_BLOCK_LEN)) ||
        ((flags & AES_FLAG_DECRYPT) && (bytes_len % AES_BLOCK_LEN)) ||
        !iv || iv_len != AES_BLOCK_LEN || flags & ~ALL_OPS || !written)
        return WALLY_EINVAL;

    blocks = bytes_len / AES_BLOCK_LEN;

    if (flags & AES_FLAG_ENCRYPT) {
        /* Determine output length from input length */
        remainder = bytes_len % AES_BLOCK_LEN;
        *written = (blocks + 1) * AES_BLOCK_LEN;
    } else {
        /* Determine output length from decrypted final block */
        const unsigned char *last = bytes + bytes_len - AES_BLOCK_LEN;
        const unsigned char *prev = last - AES_BLOCK_LEN;

        if (!--blocks)
            prev = iv;
        aes_dec(&ctx, key, key_len, last, AES_BLOCK_LEN, buf);
        for (n = 0; n < AES_BLOCK_LEN; ++n)
            buf[n] = prev[n] ^ buf[n];

        /* Modulo the resulting padding amount to the block size - we do
         * not attempt to verify the decryption by checking the padding in
         * the decrypted block. */
        remainder = AES_BLOCK_LEN - (buf[AES_BLOCK_LEN - 1] % AES_BLOCK_LEN);
        if (remainder == AES_BLOCK_LEN)
            remainder = 0;
        *written = blocks * AES_BLOCK_LEN + remainder;
    }
    if (len < *written || !*written)
        goto finish; /* Inform caller how much space is needed */

    if (!bytes_out) {
        wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
        return WALLY_EINVAL;
    }

    if (flags & AES_FLAG_DECRYPT)
        memcpy(bytes_out + blocks * AES_BLOCK_LEN, buf, remainder);

    for (i = 0; i < blocks; ++i) {
        if (flags & AES_FLAG_ENCRYPT) {
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                buf[n] = bytes[n] ^ iv[n];
            aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
            iv = bytes_out;
        } else {
            aes_dec(&ctx, key, key_len, bytes, AES_BLOCK_LEN, bytes_out);
            for (n = 0; n < AES_BLOCK_LEN; ++n)
                bytes_out[n] = bytes_out[n] ^ iv[n];
            iv = bytes;
        }
        bytes += AES_BLOCK_LEN;
        bytes_out += AES_BLOCK_LEN;
    }

    if (flags & AES_FLAG_ENCRYPT) {
        for (n = 0; n < remainder; ++n)
            buf[n] = bytes[n] ^ iv[n];
        remainder = 16 - remainder;
        for (; n < AES_BLOCK_LEN; ++n)
            buf[n] = remainder ^ iv[n];
        aes_enc(&ctx, key, key_len, buf, AES_BLOCK_LEN, bytes_out);
    }

finish:
    wally_clear_2(buf, sizeof(buf), &ctx, sizeof(ctx));
    return WALLY_OK;
}